

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void av1_cyclic_reset_segment_skip
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint segment_id_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  char in_R9B;
  int map_offset;
  int mi_y;
  uint8_t segment_id;
  int mi_stride;
  int block_index;
  int ymis;
  int xmis;
  int bh;
  int bw;
  CYCLIC_REFRESH *cr;
  int prev_segment_id;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int cdf_num;
  uint local_8c;
  uint local_88;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  segment_id_00 = (uint)((byte)*(undefined2 *)(lVar1 + 0xa7) & 7);
  lVar2 = *(long *)(in_RDI + 0x712a8);
  local_88 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_R8B];
  local_8c = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [in_R8B];
  if (*(int *)(in_RDI + 0x3c198) - in_ECX < (int)local_88) {
    local_88 = *(int *)(in_RDI + 0x3c198) - in_ECX;
  }
  if (*(int *)(in_RDI + 0x3c194) - in_EDX < (int)local_8c) {
    local_8c = *(int *)(in_RDI + 0x3c194) - in_EDX;
  }
  if (*(int *)(lVar2 + 0x6c) == 0) {
    bVar3 = av1_get_spatial_seg_pred
                      ((AV1_COMMON *)CONCAT44(local_88,local_8c),
                       (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94);
    *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xfff8 | bVar3 & 7;
    if (segment_id_00 != ((byte)*(undefined2 *)(lVar1 + 0xa7) & 7)) {
      iVar4 = in_EDX * *(int *)(in_RDI + 0x3c198) + in_ECX;
      iVar6 = *(int *)(in_RDI + 0x3c198);
      uVar8 = ((byte)*(undefined2 *)(lVar1 + 0xa7) & 7) << 0x18;
      for (iVar7 = 0; iVar7 < (int)local_8c; iVar7 = iVar7 + 1) {
        iVar5 = iVar4 + iVar7 * iVar6;
        memset((void *)(*(long *)(lVar2 + 0x28) + (long)iVar5),0,(long)(int)local_88);
        memset((void *)(*(long *)(in_RDI + 0x71298) + (long)iVar5),uVar8 >> 0x18,(long)(int)local_88
              );
        memset((void *)(*(long *)(*(long *)(in_RDI + 0x3c068) + 0x50) + (long)iVar5),uVar8 >> 0x18,
               (long)(int)local_88);
      }
    }
  }
  if (in_R9B == '\0') {
    iVar6 = cyclic_refresh_segment_id(segment_id_00);
    if (iVar6 == 1) {
      *(uint *)(in_RSI + 0x15234) = *(int *)(in_RSI + 0x15234) - local_88 * local_8c;
    }
    else {
      iVar6 = cyclic_refresh_segment_id(segment_id_00);
      if (iVar6 == 2) {
        *(uint *)(in_RSI + 0x15238) = *(int *)(in_RSI + 0x15238) - local_88 * local_8c;
      }
    }
  }
  return;
}

Assistant:

void av1_cyclic_reset_segment_skip(const AV1_COMP *cpi, MACROBLOCK *const x,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   RUN_TYPE dry_run) {
  int cdf_num;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int prev_segment_id = mbmi->segment_id;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);

  assert(cm->seg.enabled);

  if (!cr->skip_over4x4) {
    mbmi->segment_id =
        av1_get_spatial_seg_pred(cm, xd, &cdf_num, cr->skip_over4x4);
    if (prev_segment_id != mbmi->segment_id) {
      const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
      const int mi_stride = cm->mi_params.mi_cols;
      const uint8_t segment_id = mbmi->segment_id;
      for (int mi_y = 0; mi_y < ymis; mi_y++) {
        const int map_offset = block_index + mi_y * mi_stride;
        memset(&cr->map[map_offset], 0, xmis);
        memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
        memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
      }
    }
  }
  if (!dry_run) {
    if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks -= xmis * ymis;
    else if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks -= xmis * ymis;
  }
}